

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatdc.c
# Opt level: O0

boolean ecx_configdc(ecx_contextt *context)

{
  ushort uVar1;
  uint16 slave;
  ecx_contextt *peVar2;
  uint8 uVar3;
  int iVar4;
  int32 iVar5;
  int32 iVar6;
  int32 iVar7;
  int32 iVar8;
  bool bVar9;
  int aiStack_58 [2];
  int32 tlist [4];
  byte abStack_3e [4];
  byte local_3a;
  byte local_39;
  int8 plist [4];
  int8 nlist;
  long lStack_38;
  uint8 entryport;
  int64 hrt;
  int32 dt3;
  int32 dt2;
  int32 dt1;
  int32 ht;
  ushort local_18;
  uint16 prevDCslave;
  uint16 parenthold;
  uint16 child;
  uint16 parent;
  uint16 slaveh;
  uint16 wc;
  uint16 i;
  ecx_contextt *context_local;
  
  ht._0_2_ = 0;
  dt1._2_2_ = 0;
  context->slavelist->hasdc = '\0';
  context->grouplist->hasdc = '\0';
  dt2 = 0;
  _parent = context;
  ecx_BWR(context->port,0,0x900,4,&dt2,2000);
  for (child = 1; (int)(uint)child <= *_parent->slavecount; child = child + 1) {
    _parent->slavelist[child].consumedports = _parent->slavelist[child].activeports;
    if (_parent->slavelist[child].hasdc == '\0') {
      _parent->slavelist[child].DCrtA = 0;
      _parent->slavelist[child].DCrtB = 0;
      _parent->slavelist[child].DCrtC = 0;
      _parent->slavelist[child].DCrtD = 0;
      local_18 = _parent->slavelist[child].parent;
      if ((local_18 != 0) && (2 < _parent->slavelist[local_18].topology)) {
        ht._0_2_ = local_18;
      }
      if (((uint16)ht != 0) && (_parent->slavelist[child].topology == '\x01')) {
        ecx_parentport(_parent,(uint16)ht);
        ht._0_2_ = 0;
      }
    }
    else {
      if (_parent->slavelist->hasdc == '\0') {
        _parent->slavelist->hasdc = '\x01';
        _parent->slavelist->DCnext = child;
        _parent->slavelist[child].DCprevious = 0;
        _parent->grouplist->hasdc = '\x01';
        _parent->grouplist->DCnext = child;
      }
      else {
        _parent->slavelist[dt1._2_2_].DCnext = child;
        _parent->slavelist[child].DCprevious = dt1._2_2_;
      }
      ht._0_2_ = 0;
      dt1._2_2_ = child;
      prevDCslave = _parent->slavelist[child].configadr;
      iVar4 = ecx_FPRD(_parent->port,prevDCslave,0x900,4,&dt2,2000);
      parenthold = (uint16)iVar4;
      _parent->slavelist[child].DCrtA = dt2;
      iVar4 = ecx_FPRD(_parent->port,prevDCslave,0x918,8,&stack0xffffffffffffffc8,2000);
      parenthold = (uint16)iVar4;
      lStack_38 = -lStack_38;
      iVar4 = ecx_FPWR(_parent->port,prevDCslave,0x920,8,&stack0xffffffffffffffc8,2000);
      parenthold = (uint16)iVar4;
      iVar4 = ecx_FPRD(_parent->port,prevDCslave,0x904,4,&dt2,2000);
      parenthold = (uint16)iVar4;
      _parent->slavelist[child].DCrtB = dt2;
      iVar4 = ecx_FPRD(_parent->port,prevDCslave,0x908,4,&dt2,2000);
      parenthold = (uint16)iVar4;
      _parent->slavelist[child].DCrtC = dt2;
      iVar4 = ecx_FPRD(_parent->port,prevDCslave,0x90c,4,&dt2,2000);
      parenthold = (uint16)iVar4;
      _parent->slavelist[child].DCrtD = dt2;
      local_3a = 0;
      bVar9 = (_parent->slavelist[child].activeports & 1) != 0;
      if (bVar9) {
        abStack_3e[0] = 0;
        aiStack_58[0] = _parent->slavelist[child].DCrtA;
        local_3a = 1;
      }
      local_3a = bVar9;
      if ((_parent->slavelist[child].activeports & 8) != 0) {
        abStack_3e[bVar9] = 3;
        aiStack_58[bVar9] = _parent->slavelist[child].DCrtD;
        local_3a = bVar9 + 1;
      }
      if ((_parent->slavelist[child].activeports & 2) != 0) {
        abStack_3e[(char)local_3a] = 1;
        aiStack_58[(char)local_3a] = _parent->slavelist[child].DCrtB;
        local_3a = local_3a + 1;
      }
      if ((_parent->slavelist[child].activeports & 4) != 0) {
        abStack_3e[(char)local_3a] = 2;
        aiStack_58[(char)local_3a] = _parent->slavelist[child].DCrtC;
        local_3a = local_3a + 1;
      }
      local_39 = 0;
      if ((1 < local_3a) && (aiStack_58[1] < aiStack_58[0])) {
        local_39 = 1;
      }
      if ((2 < local_3a) && (tlist[0] < aiStack_58[local_39])) {
        local_39 = 2;
      }
      if ((3 < local_3a) && (tlist[1] < aiStack_58[local_39])) {
        local_39 = 3;
      }
      local_39 = abStack_3e[local_39];
      _parent->slavelist[child].entryport = local_39;
      _parent->slavelist[child].consumedports =
           _parent->slavelist[child].consumedports & ((byte)(1 << (local_39 & 0x1f)) ^ 0xff);
      local_18 = child;
      do {
        ht._2_2_ = local_18;
        local_18 = _parent->slavelist[local_18].parent;
        bVar9 = true;
        if (local_18 != 0) {
          bVar9 = _parent->slavelist[local_18].hasdc != '\0';
        }
      } while (!bVar9);
      if (local_18 != 0) {
        uVar3 = ecx_parentport(_parent,local_18);
        _parent->slavelist[child].parentport = uVar3;
        if (_parent->slavelist[local_18].topology == '\x01') {
          _parent->slavelist[child].parentport = _parent->slavelist[local_18].entryport;
        }
        dt3 = 0;
        hrt._4_4_ = 0;
        iVar5 = ecx_porttime(_parent,local_18,_parent->slavelist[child].parentport);
        peVar2 = _parent;
        uVar1 = local_18;
        uVar3 = ecx_prevport(_parent,local_18,_parent->slavelist[child].parentport);
        iVar6 = ecx_porttime(peVar2,uVar1,uVar3);
        peVar2 = _parent;
        slave = child;
        if (1 < _parent->slavelist[child].topology) {
          uVar3 = ecx_prevport(_parent,child,_parent->slavelist[child].entryport);
          iVar7 = ecx_porttime(peVar2,slave,uVar3);
          iVar8 = ecx_porttime(_parent,child,_parent->slavelist[child].entryport);
          dt3 = iVar7 - iVar8;
        }
        peVar2 = _parent;
        uVar1 = local_18;
        if (iVar5 - iVar6 < dt3) {
          dt3 = -dt3;
        }
        if (1 < (int)((uint)ht._2_2_ - (uint)local_18)) {
          uVar3 = ecx_prevport(_parent,local_18,_parent->slavelist[child].parentport);
          iVar7 = ecx_porttime(peVar2,uVar1,uVar3);
          iVar8 = ecx_porttime(_parent,local_18,_parent->slavelist[local_18].entryport);
          hrt._4_4_ = iVar7 - iVar8;
        }
        if (hrt._4_4_ < 0) {
          hrt._4_4_ = -hrt._4_4_;
        }
        _parent->slavelist[child].pdelay =
             ((iVar5 - iVar6) - dt3) / 2 + hrt._4_4_ + _parent->slavelist[local_18].pdelay;
        dt2 = _parent->slavelist[child].pdelay;
        iVar4 = ecx_FPWR(_parent->port,prevDCslave,0x928,4,&dt2,2000);
        parenthold = (uint16)iVar4;
      }
    }
  }
  return _parent->slavelist->hasdc;
}

Assistant:

boolean ecx_configdc(ecx_contextt *context)
{
   uint16 i, wc, slaveh, parent, child;
   uint16 parenthold = 0;
   uint16 prevDCslave = 0;
   int32 ht, dt1, dt2, dt3;
   int64 hrt;
   uint8 entryport;
   int8 nlist;
   int8 plist[4];
   int32 tlist[4];

   context->slavelist[0].hasdc = FALSE;
   context->grouplist[0].hasdc = FALSE;
   ht = 0;
   ecx_BWR(context->port, 0, ECT_REG_DCTIME0, sizeof(ht), &ht, EC_TIMEOUTRET);  /* latch DCrecvTimeA of all slaves */
   for (i = 1; i <= *(context->slavecount); i++)
   {
      context->slavelist[i].consumedports = context->slavelist[i].activeports;
      if (context->slavelist[i].hasdc)
      {
         if (!context->slavelist[0].hasdc)
         {
            context->slavelist[0].hasdc = TRUE;
            context->slavelist[0].DCnext = i;
            context->slavelist[i].DCprevious = 0;
            context->grouplist[0].hasdc = TRUE;
            context->grouplist[0].DCnext = i;
         }
         else
         {
            context->slavelist[prevDCslave].DCnext = i;
            context->slavelist[i].DCprevious = prevDCslave;
         }
         /* this branch has DC slave so remove parenthold */
         parenthold = 0;
         prevDCslave = i;
         slaveh = context->slavelist[i].configadr;
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCTIME0, sizeof(ht), &ht, EC_TIMEOUTRET);
         context->slavelist[i].DCrtA = etohl(ht);
         /* 64bit latched DCrecvTimeA of each specific slave */
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCSOF, sizeof(hrt), &hrt, EC_TIMEOUTRET);
         /* use it as offset in order to set local time around 0 */
         hrt = htoell(-etohll(hrt));
         /* save it in the offset register */
         wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSYSOFFSET, sizeof(hrt), &hrt, EC_TIMEOUTRET);
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCTIME1, sizeof(ht), &ht, EC_TIMEOUTRET);
         context->slavelist[i].DCrtB = etohl(ht);
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCTIME2, sizeof(ht), &ht, EC_TIMEOUTRET);
         context->slavelist[i].DCrtC = etohl(ht);
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCTIME3, sizeof(ht), &ht, EC_TIMEOUTRET);
         context->slavelist[i].DCrtD = etohl(ht);

         /* make list of active ports and their time stamps */
         nlist = 0;
         if (context->slavelist[i].activeports & PORTM0) 
         {
            plist[nlist] = 0;
            tlist[nlist] = context->slavelist[i].DCrtA;
            nlist++;
         }
         if (context->slavelist[i].activeports & PORTM3) 
         {
            plist[nlist] = 3;
            tlist[nlist] = context->slavelist[i].DCrtD;
            nlist++;
         }
         if (context->slavelist[i].activeports & PORTM1) 
         {
            plist[nlist] = 1;
            tlist[nlist] = context->slavelist[i].DCrtB;
            nlist++;
         }
         if (context->slavelist[i].activeports & PORTM2) 
         {
            plist[nlist] = 2;
            tlist[nlist] = context->slavelist[i].DCrtC;
            nlist++;
         }
         /* entryport is port with the lowest timestamp */
         entryport = 0;
         if((nlist > 1) && (tlist[1] < tlist[entryport]))
         {
            entryport = 1;
         }         
         if((nlist > 2) && (tlist[2] < tlist[entryport]))
         {
            entryport = 2;
         }
         if((nlist > 3) && (tlist[3] < tlist[entryport]))
         {
            entryport = 3;
         }
         entryport = plist[entryport];
         context->slavelist[i].entryport = entryport;
         /* consume entryport from activeports */
         context->slavelist[i].consumedports &= (uint8)~(1 << entryport);

         /* finding DC parent of current */
         parent = i;
         do
         {
            child = parent;
            parent = context->slavelist[parent].parent;
         }
         while (!((parent == 0) || (context->slavelist[parent].hasdc)));
         /* only calculate propagation delay if slave is not the first */
         if (parent > 0)
         {
            /* find port on parent this slave is connected to */
            context->slavelist[i].parentport = ecx_parentport(context, parent);
            if (context->slavelist[parent].topology == 1)
            {
               context->slavelist[i].parentport = context->slavelist[parent].entryport;
            }

            dt1 = 0;
            dt2 = 0;
            /* delta time of (parentport - 1) - parentport */
            /* note: order of ports is 0 - 3 - 1 -2 */
            /* non active ports are skipped */
            dt3 = ecx_porttime(context, parent, context->slavelist[i].parentport) -
                  ecx_porttime(context, parent, 
                    ecx_prevport(context, parent, context->slavelist[i].parentport));
            /* current slave has children */
            /* those childrens delays need to be substacted */
            if (context->slavelist[i].topology > 1)
            {
               dt1 = ecx_porttime(context, i, 
                        ecx_prevport(context, i, context->slavelist[i].entryport)) -
                     ecx_porttime(context, i, context->slavelist[i].entryport);
            }
            /* we are only interrested in positive diference */
            if (dt1 > dt3) dt1 = -dt1;
            /* current slave is not the first child of parent */
            /* previous childs delays need to be added */
            if ((child - parent) > 1)
            {
               dt2 = ecx_porttime(context, parent, 
                        ecx_prevport(context, parent, context->slavelist[i].parentport)) -
                     ecx_porttime(context, parent, context->slavelist[parent].entryport);
            }
            if (dt2 < 0) dt2 = -dt2;

            /* calculate current slave delay from delta times */
            /* assumption : forward delay equals return delay */
            context->slavelist[i].pdelay = ((dt3 - dt1) / 2) + dt2 +
               context->slavelist[parent].pdelay;
            ht = htoel(context->slavelist[i].pdelay);
            /* write propagation delay*/
            wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSYSDELAY, sizeof(ht), &ht, EC_TIMEOUTRET);
         }
      }
      else
      {
         context->slavelist[i].DCrtA = 0;
         context->slavelist[i].DCrtB = 0;
         context->slavelist[i].DCrtC = 0;
         context->slavelist[i].DCrtD = 0;
         parent = context->slavelist[i].parent;
         /* if non DC slave found on first position on branch hold root parent */
         if ( (parent > 0) && (context->slavelist[parent].topology > 2))
            parenthold = parent;
         /* if branch has no DC slaves consume port on root parent */
         if ( parenthold && (context->slavelist[i].topology == 1))
         {
            ecx_parentport(context, parenthold);
            parenthold = 0;
         }
      }
   }

   return context->slavelist[0].hasdc;
}